

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
SetPropertyFromDescriptor<false,int>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<int> *descriptor,Var value,PropertyOperationFlags flags
          ,PropertyValueInfo *info)

{
  JavascriptString *str1;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  DictionaryTypeHandlerBase<int> *pDVar6;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *pSVar7;
  DynamicType *pDVar8;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *this_00;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar9;
  JavascriptString **ppJVar10;
  ScriptContext *pSVar11;
  Var pvVar12;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar13;
  RecyclerWeakReference<Js::DynamicObject> *this_01;
  PropertyRecord *pPVar14;
  bool local_72;
  bool local_71;
  DynamicObject *local_70;
  DynamicObject *localSingletonInstance;
  int propertyIndex;
  bool throwIfNotExtensible;
  ScriptContext *scriptContext;
  Var value_local;
  SimpleDictionaryPropertyDescriptor<int> *descriptor_local;
  int propertyKey_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_local;
  
  scriptContext = (ScriptContext *)value;
  value_local = descriptor;
  descriptor_local._0_4_ = propertyKey;
  descriptor_local._4_4_ = propertyId;
  _propertyKey_local = instance;
  instance_local = (DynamicObject *)this;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  _propertyIndex = RecyclableObject::GetScriptContext(&_propertyKey_local->super_RecyclableObject);
  localSingletonInstance._7_1_ =
       (flags & (PropertyOperation_ThrowIfNotExtensible|PropertyOperation_StrictMode)) !=
       PropertyOperation_None;
  if ((*(byte *)((long)value_local + 1) & 0x10) != 0) {
    pDVar6 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
             ConvertToDictionaryType
                       ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this,
                        _propertyKey_local);
    iVar3 = (*(pDVar6->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17])
                      (pDVar6,_propertyKey_local,(ulong)descriptor_local._4_4_,scriptContext,
                       (ulong)flags,info);
    return iVar3;
  }
  if ((*(byte *)((long)value_local + 1) & 8) == 0) {
    if (((*(byte *)((long)value_local + 1) & 4) == 0) &&
       ((flags & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None)) {
      JavascriptError::ThrowCantAssignIfStrictMode(flags,_propertyIndex);
      PropertyValueInfo::SetNoCache(info,&_propertyKey_local->super_RecyclableObject);
      return 0;
    }
    goto LAB_014cf433;
  }
  bVar2 = DynamicTypeHandler::GetIsLocked((DynamicTypeHandler *)this);
  if (bVar2) {
    pSVar7 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
             ConvertToNonSharedSimpleDictionaryType
                       ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this,
                        _propertyKey_local);
    iVar3 = (*(pSVar7->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17])
                      (pSVar7,_propertyKey_local,(ulong)(uint)descriptor_local,scriptContext,
                       (ulong)flags,info);
    return iVar3;
  }
  pDVar8 = DynamicObject::GetDynamicType(_propertyKey_local);
  bVar2 = DynamicType::GetIsLocked(pDVar8);
  if (bVar2) {
    bVar2 = DynamicTypeHandler::GetIsShared((DynamicTypeHandler *)this);
    if (bVar2) {
LAB_014cf20d:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x547,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    else {
      pDVar8 = DynamicObject::GetDynamicType(_propertyKey_local);
      bVar2 = DynamicType::GetIsShared(pDVar8);
      if (bVar2) goto LAB_014cf20d;
    }
    DynamicObject::ChangeType(_propertyKey_local);
  }
  if (((byte)this[0x28] >> 1 & 1) != 0) {
    this_00 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::AsUnordered
                        ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this
                        );
    bVar2 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
            TryUndeleteProperty(this_00,_propertyKey_local,*(int *)((long)value_local + 4),
                                (int *)&localSingletonInstance);
    if (bVar2) {
      pBVar9 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                             *)(this + 0x18));
      ppJVar10 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(pBVar9,(int)localSingletonInstance);
      str1 = *ppJVar10;
      pPVar14 = TMapKey_OptionalConvertPropertyIdToPropertyRecord
                          (_propertyIndex,(uint)descriptor_local);
      bVar2 = PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals(str1,pPVar14);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pBVar9 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                             *)(this + 0x18));
      value_local = JsUtil::
                    BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                    ::GetReferenceAt(pBVar9,(int)localSingletonInstance);
    }
  }
  bVar2 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
          SupportsSwitchingToUnordered
                    ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this,
                     _propertyIndex);
  if (bVar2) {
    this[0x29] = (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>)
                 ((char)this[0x29] + -1);
  }
  *(undefined1 *)((long)value_local + 1) = 7;
  DynamicObject::SetHasNoEnumerableProperties(_propertyKey_local,false);
  pSVar11 = RecyclableObject::GetScriptContext(&_propertyKey_local->super_RecyclableObject);
  descriptor_local._4_4_ = TPropertyKey_GetOptionalPropertyId<int>(pSVar11,(uint)descriptor_local);
  if (descriptor_local._4_4_ != 0xffffffff) {
    ScriptContext::InvalidateProtoCaches(_propertyIndex,descriptor_local._4_4_);
  }
  *(undefined1 *)((long)value_local + 1) = 7;
LAB_014cf433:
  pSVar11 = _propertyIndex;
  if (*(int *)((long)value_local + 4) != -1) {
    if (((*(byte *)((long)value_local + 1) & 0xc0) != 0) &&
       ((flags & PropertyOperation_AllowUndecl) == PropertyOperation_None)) {
      pvVar12 = DynamicObject::GetSlot(_propertyKey_local,*(int *)((long)value_local + 4));
      bVar2 = ScriptContext::IsUndeclBlockVar(pSVar11,pvVar12);
      if ((bVar2) &&
         ((flags & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None)) {
        JavascriptError::ThrowReferenceError(_propertyIndex,-0x7ff5ec07,(PCWSTR)0x0);
      }
    }
    ppRVar13 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)(this + 0x20));
    if (*ppRVar13 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      local_70 = (DynamicObject *)0x0;
    }
    else {
      this_01 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                operator->((WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_> *)
                           (this + 0x20));
      local_70 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_01);
    }
    ppRVar13 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                         ((WriteBarrierPtr *)(this + 0x20));
    if ((*ppRVar13 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       (local_70 != _propertyKey_local)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x588,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((*value_local >> 1 & 1) == 0) {
      if (((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
           (*(byte *)value_local = *value_local & 0xfd | 2, local_70 == _propertyKey_local)) &&
          (bVar2 = TPropertyKey_IsInternalPropertyId((uint)descriptor_local), !bVar2)) &&
         ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None)) {
        bVar2 = DynamicTypeHandler::GetIsShared((DynamicTypeHandler *)this);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x594,"(!GetIsShared())","!GetIsShared()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        if (scriptContext == (ScriptContext *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x595,"(value != nullptr)","value != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        BVar4 = RecyclableObject::IsExternal(&_propertyKey_local->super_RecyclableObject);
        if (BVar4 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        bVar2 = VarIs<Js::JavascriptFunction>(scriptContext);
        if (bVar2) {
          local_71 = DynamicTypeHandler::ShouldFixMethodProperties();
        }
        else {
          bVar2 = DynamicTypeHandler::ShouldFixDataProperties();
          local_72 = false;
          if (bVar2) {
            local_72 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                                 (_propertyKey_local,descriptor_local._4_4_,scriptContext);
          }
          local_71 = local_72;
        }
        *(byte *)value_local = *value_local & 0xfb | local_71 << 2;
      }
    }
    else {
      pPVar14 = TMapKey_OptionalConvertPropertyIdToPropertyRecord
                          (_propertyIndex,(uint)descriptor_local);
      pvVar12 = value_local;
      pSVar11 = RecyclableObject::GetScriptContext(&_propertyKey_local->super_RecyclableObject);
      InvalidateFixedField<Js::PropertyRecord_const*>
                (this,pPVar14,(SimpleDictionaryPropertyDescriptor<int> *)pvVar12,pSVar11);
    }
    DynamicTypeHandler::SetSlotUnchecked
              (_propertyKey_local,*(int *)((long)value_local + 4),scriptContext);
    bVar2 = SimpleDictionaryPropertyDescriptor<int>::IsOrMayBecomeFixed
                      ((SimpleDictionaryPropertyDescriptor<int> *)value_local);
    if (bVar2) {
      PropertyValueInfo::SetNoCache(info,&_propertyKey_local->super_RecyclableObject);
    }
    else {
      SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
      SetPropertyValueInfoNonFixed
                ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this,info,
                 &_propertyKey_local->super_RecyclableObject,
                 *(BigPropertyIndex *)((long)value_local + 4),
                 *(PropertyAttributes *)((long)value_local + 1),InlineCacheNoFlags);
    }
  }
  descriptor_local._4_4_ =
       TPropertyKey_GetUpdateSideEffectPropertyId<int>
                 (descriptor_local._4_4_,(uint)descriptor_local);
  if (descriptor_local._4_4_ != -1) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,_propertyKey_local,descriptor_local._4_4_,scriptContext,
               SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }